

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

uint __thiscall Engine::getLocalFunctionNameByString(Engine *this,string *name)

{
  uint uVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  size_type *psVar5;
  
  uVar1 = this->localFunctionsCount;
  if ((ulong)uVar1 != 0) {
    sVar2 = name->_M_string_length;
    psVar5 = &this->localFunctionNames->_M_string_length;
    uVar4 = 0;
    do {
      __n = *psVar5;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((string *)(psVar5 + -1))->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n),
          iVar3 == 0)))) {
        return (uint)uVar4;
      }
      uVar4 = uVar4 + 1;
      psVar5 = psVar5 + 4;
    } while (uVar1 != uVar4);
  }
  return 0xffffffff;
}

Assistant:

unsigned int Engine::getLocalFunctionNameByString(std::string name) {
	unsigned int i;
	for (i = 0; i < this->localFunctionsCount; i++) {
		if (this->localFunctionNames[i] == name) {
			return i;
		}
	}
	return CANT_FIND;
}